

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

session_params *
libtorrent::read_session_params
          (session_params *__return_storage_ptr__,bdecode_node *e,save_state_flags_t flags)

{
  bool bVar1;
  type_t tVar2;
  dht_state local_268;
  string_view local_220;
  bdecode_node local_210;
  uint local_1d0;
  uint local_1cc;
  uint local_1c8;
  dht_settings local_1c4;
  string_view local_180;
  bdecode_node local_170;
  uint local_12c;
  uint local_128;
  uint local_124;
  settings_pack local_120;
  string_view local_c8;
  bdecode_node local_b8;
  uint local_78;
  uint local_74;
  uint local_70 [2];
  undefined1 local_68 [8];
  bdecode_node settings;
  bdecode_node *e_local;
  save_state_flags_t flags_local;
  session_params *params;
  
  settings._63_1_ = 0;
  session_params::session_params(__return_storage_ptr__);
  bdecode_node::bdecode_node((bdecode_node *)local_68);
  tVar2 = bdecode_node::type(e);
  if (tVar2 == dict_t) {
    local_78 = 1;
    local_74 = flags.m_val;
    local_70[0] = (uint)libtorrent::flags::operator&
                                  (flags.m_val,
                                   (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>
                                    )1);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_70);
    if (bVar1) {
      boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_c8,"settings");
      bdecode_node::dict_find_dict(&local_b8,e,local_c8);
      bdecode_node::operator=((bdecode_node *)local_68,&local_b8);
      bdecode_node::~bdecode_node(&local_b8);
      bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_68);
      if (bVar1) {
        load_pack_from_dict(&local_120,(bdecode_node *)local_68);
        settings_pack::operator=(&__return_storage_ptr__->settings,&local_120);
        settings_pack::~settings_pack(&local_120);
      }
    }
    local_12c = 2;
    local_128 = flags.m_val;
    local_124 = (uint)libtorrent::flags::operator&
                                (flags.m_val,
                                 (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>
                                  )2);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_124);
    if (bVar1) {
      boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_180,"dht");
      bdecode_node::dict_find_dict(&local_170,e,local_180);
      bdecode_node::operator=((bdecode_node *)local_68,&local_170);
      bdecode_node::~bdecode_node(&local_170);
      bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_68);
      if (bVar1) {
        dht::read_dht_settings(&local_1c4,(bdecode_node *)local_68);
        memcpy(&__return_storage_ptr__->dht_settings,&local_1c4,0x44);
      }
    }
    local_1d0 = 4;
    local_1cc = flags.m_val;
    local_1c8 = (uint)libtorrent::flags::operator&
                                (flags.m_val,
                                 (bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void>
                                  )4);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_1c8);
    if (bVar1) {
      boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_220,"dht state");
      bdecode_node::dict_find_dict(&local_210,e,local_220);
      bdecode_node::operator=((bdecode_node *)local_68,&local_210);
      bdecode_node::~bdecode_node(&local_210);
      bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_68);
      if (bVar1) {
        dht::read_dht_state(&local_268,(bdecode_node *)local_68);
        dht::dht_state::operator=(&__return_storage_ptr__->dht_state,&local_268);
        dht::dht_state::~dht_state(&local_268);
      }
    }
  }
  settings._63_1_ = 1;
  local_70[1] = 1;
  bdecode_node::~bdecode_node((bdecode_node *)local_68);
  if ((settings._63_1_ & 1) == 0) {
    session_params::~session_params(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

session_params read_session_params(bdecode_node const& e, save_state_flags_t const flags)
	{
		session_params params;

		bdecode_node settings;
		if (e.type() != bdecode_node::dict_t) return params;

		if (flags & session_handle::save_settings)
		{
			settings = e.dict_find_dict("settings");
			if (settings)
			{
				params.settings = load_pack_from_dict(settings);
			}
		}

#ifndef TORRENT_DISABLE_DHT
		if (flags & session_handle::save_dht_settings)
		{
			settings = e.dict_find_dict("dht");
			if (settings)
			{
				params.dht_settings = dht::read_dht_settings(settings);
			}
		}

		if (flags & session_handle::save_dht_state)
		{
			settings = e.dict_find_dict("dht state");
			if (settings)
			{
				params.dht_state = dht::read_dht_state(settings);
			}
		}
#endif

		return params;
	}